

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall QtMWidgets::Switch::mouseReleaseEvent(Switch *this,QMouseEvent *event)

{
  State SVar1;
  MouseButton MVar2;
  int iVar3;
  int iVar4;
  SwitchPrivate *pSVar5;
  socklen_t *in_RCX;
  sockaddr *__addr;
  QRect local_4c;
  QRect local_3c;
  QRect local_2c;
  int local_1c;
  QMouseEvent *pQStack_18;
  int distance;
  QMouseEvent *event_local;
  Switch *this_local;
  
  pQStack_18 = event;
  event_local = (QMouseEvent *)this;
  MVar2 = QSinglePointEvent::button((QSinglePointEvent *)event);
  if (MVar2 == LeftButton) {
    QEvent::accept((QEvent *)pQStack_18,(int)event,__addr,in_RCX);
    pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    pSVar5->leftMouseButtonPressed = false;
    local_2c = QWidget::rect(&this->super_QWidget);
    iVar3 = QRect::width(&local_2c);
    pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    local_1c = iVar3 + pSVar5->radius * -2;
    pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    iVar3 = pSVar5->mouseMoveDelta;
    iVar4 = FingerGeometry::touchBounce();
    if (iVar4 < iVar3) {
      pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
               ::operator->(&this->d);
      if (local_1c / 2 < pSVar5->offset) {
        pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
                 ::operator->(&this->d);
        if (pSVar5->state < NotAcceptedCheck) {
          pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
                   ::operator->(&this->d);
          SwitchPrivate::setState(pSVar5,NotAcceptedCheck);
        }
        else {
          pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
                   ::operator->(&this->d);
          local_4c = QWidget::rect(&this->super_QWidget);
          SwitchPrivate::initOffset(pSVar5,&local_4c);
          QWidget::update();
        }
      }
      else {
        pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
                 ::operator->(&this->d);
        if (pSVar5->state == NotAcceptedCheck || pSVar5->state == AcceptedCheck) {
          pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
                   ::operator->(&this->d);
          SwitchPrivate::setState(pSVar5,NotAcceptedUncheck);
        }
        else {
          pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
                   ::operator->(&this->d);
          local_3c = QWidget::rect(&this->super_QWidget);
          SwitchPrivate::initOffset(pSVar5,&local_3c);
          QWidget::update();
        }
      }
    }
    else {
      pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
               ::operator->(&this->d);
      SVar1 = pSVar5->state;
      if (SVar1 < NotAcceptedCheck) {
        pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
                 ::operator->(&this->d);
        SwitchPrivate::setState(pSVar5,NotAcceptedCheck);
      }
      else if (SVar1 == NotAcceptedCheck || SVar1 == AcceptedCheck) {
        pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
                 ::operator->(&this->d);
        SwitchPrivate::setState(pSVar5,NotAcceptedUncheck);
      }
    }
  }
  else {
    QEvent::ignore((QEvent *)pQStack_18);
  }
  return;
}

Assistant:

void
Switch::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		event->accept();

		d->leftMouseButtonPressed = false;

		const int distance = rect().width() - d->radius * 2;

		if( d->mouseMoveDelta <= FingerGeometry::touchBounce() )
		{
			switch( d->state )
			{
				case NotAcceptedCheck :
				case AcceptedCheck :
					d->setState( NotAcceptedUncheck );
				break;

				case NotAcceptedUncheck :
				case AcceptedUncheck :
					d->setState( NotAcceptedCheck );
				break;

				default :
					break;
			}

			return;
		}

		if( d->offset <= distance / 2 )
		{
			switch( d->state )
			{
				case NotAcceptedCheck :
				case AcceptedCheck :
					d->setState( NotAcceptedUncheck );
				break;

				default :
				{
					d->initOffset( rect() );
					update();
				}
				break;
			}
		}
		else
		{
			switch( d->state )
			{
				case NotAcceptedUncheck :
				case AcceptedUncheck :
					d->setState( NotAcceptedCheck );
				break;

				default :
				{
					d->initOffset( rect() );
					update();
				}
				break;
			}
		}
	}
	else
		event->ignore();
}